

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.cpp
# Opt level: O0

void * thread_routine(void *arg_)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  undefined8 *in_RDI;
  thread_t *self;
  char *errstr_1;
  char *errstr;
  int rc;
  sigset_t signal_set;
  thread_t *in_stack_ffffffffffffff60;
  sigset_t local_88;
  undefined8 *local_8;
  
  local_8 = in_RDI;
  iVar1 = sigfillset(&local_88);
  if (iVar1 != 0) {
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    fprintf(_stderr,"%s (%s:%d)\n",pcVar3,
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/thread.cpp"
            ,0xfa);
    fflush(_stderr);
    zmq::zmq_abort((char *)0x20fc41);
  }
  iVar1 = pthread_sigmask(0,&local_88,(__sigset_t *)0x0);
  if (iVar1 != 0) {
    in_stack_ffffffffffffff60 = (thread_t *)strerror(iVar1);
    fprintf(_stderr,"%s (%s:%d)\n",in_stack_ffffffffffffff60,
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/thread.cpp"
            ,0xfc);
    fflush(_stderr);
    zmq::zmq_abort((char *)0x20fcb3);
  }
  zmq::thread_t::applySchedulingParameters((thread_t *)signal_set.__val[6]);
  zmq::thread_t::applyThreadName(in_stack_ffffffffffffff60);
  (*(code *)*local_8)(local_8[1]);
  return (void *)0x0;
}

Assistant:

static void *thread_routine (void *arg_)
{
#if !defined ZMQ_HAVE_OPENVMS && !defined ZMQ_HAVE_ANDROID
    //  Following code will guarantee more predictable latencies as it'll
    //  disallow any signal handling in the I/O thread.
    sigset_t signal_set;
    int rc = sigfillset (&signal_set);
    errno_assert (rc == 0);
    rc = pthread_sigmask (SIG_BLOCK, &signal_set, NULL);
    posix_assert (rc);
#endif
    zmq::thread_t *self = (zmq::thread_t *) arg_;
    self->applySchedulingParameters ();
    self->applyThreadName ();
    self->_tfn (self->_arg);
    return NULL;
}